

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::AnyMetadata::InternalPackFrom
          (AnyMetadata *this,MessageLite *message,StringPiece type_url_prefix,StringPiece type_name)

{
  ArenaStringPtr *pAVar1;
  string *output;
  char *pcVar2;
  StringPiece message_name;
  StringPiece type_url_prefix_00;
  string local_50;
  
  pAVar1 = this->type_url_;
  pcVar2 = (char *)type_name.length_;
  InitProtobufDefaults();
  message_name.length_ = (stringpiece_ssize_type)type_url_prefix.ptr_;
  message_name.ptr_ = (char *)type_name.length_;
  type_url_prefix_00.length_ = (stringpiece_ssize_type)pcVar2;
  type_url_prefix_00.ptr_ = (char *)type_url_prefix.length_;
  GetTypeUrl_abi_cxx11_(&local_50,(internal *)type_name.ptr_,message_name,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(pAVar1,(string *)&fixed_address_empty_string_abi_cxx11_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pAVar1 = this->value_;
  output = pAVar1->ptr_;
  if (output == (string *)&fixed_address_empty_string_abi_cxx11_) {
    ArenaStringPtr::CreateInstanceNoArena(pAVar1,(string *)&fixed_address_empty_string_abi_cxx11_);
    output = pAVar1->ptr_;
  }
  MessageLite::SerializeToString(message,output);
  return;
}

Assistant:

void AnyMetadata::InternalPackFrom(const MessageLite& message,
                                   StringPiece type_url_prefix,
                                   StringPiece type_name) {
  type_url_->SetNoArena(&::google::protobuf::internal::GetEmptyString(),
                        GetTypeUrl(type_name, type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::google::protobuf::internal::GetEmptyStringAlreadyInited()));
}